

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRMaskUtil.cpp
# Opt level: O2

bool ZXing::QRCode::MaskUtil::HasPatternAt<7ul>
               (array<bool,_7UL> *pattern,Trit *begin,int count,int stride)

{
  Trit *pTVar1;
  long lVar2;
  
  pTVar1 = begin + count * 7;
  for (lVar2 = 0;
      (lVar2 != 7 && pTVar1 > begin && (pattern->_M_elems[lVar2] == (begin->value == true_v)));
      lVar2 = lVar2 + 1) {
    begin = begin + count;
  }
  return lVar2 == 7 || pTVar1 <= begin;
}

Assistant:

static bool HasPatternAt(const std::array<bool, N>& pattern, const Trit* begin, int count, int stride)
{
	assert(std::abs(count) <= (int)N);
	auto end = begin + count * stride;
	if (count < 0)
		std::swap(begin, end);
	auto a = begin;
	for (auto b = pattern.begin(); a < end && b != pattern.end(); a += stride, ++b)
		if (*a != *b)
			return false;
	return true;
}